

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O0

ParameterPoint *
anurbs::PointOnCurveProjection<3L>::project_to_line
          (ParameterPoint *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,double *t0,
          double *t1)

{
  double dVar1;
  type local_170;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_150;
  undefined1 local_120 [8];
  Vector closest_point;
  double t;
  double do2ptr;
  undefined1 local_e0 [8];
  Vector o2pt;
  type local_c0;
  undefined1 local_a0 [8];
  Vector r;
  Vector o;
  double l;
  undefined1 local_50 [8];
  Vector dif;
  double *t1_local;
  double *t0_local;
  Vector *b_local;
  Vector *a_local;
  Vector *point_local;
  
  dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       (double)t1;
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)&l,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)b,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)a);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((Matrix<double,1,3,1,1,3> *)local_50,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&l);
  dVar1 = squared_norm((Vector<3> *)local_50);
  if (1e-14 <= dVar1) {
    Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
              ((Matrix<double,_1,_3,_1,_1,_3> *)
               (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2),a);
    o2pt.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
         1.0 / dVar1;
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator*
              (&local_c0,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)local_50,
               o2pt.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
               array + 2);
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>>
              ((Matrix<double,1,3,1,1,3> *)local_a0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                *)&local_c0);
    Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                *)&do2ptr,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)point,
               (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
               (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                array + 2));
    Eigen::Matrix<double,1,3,1,1,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
              ((Matrix<double,1,3,1,1,3> *)local_e0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                *)&do2ptr);
    t = dot((Vector<3> *)local_e0,(Vector<3> *)local_a0);
    if (0.0 <= t) {
      if (t <= 1.0) {
        closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
        array[2] = (*(double *)
                     dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                     m_data.array[2] - *t0) * t + *t0;
        Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator*
                  (&local_170,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)local_50,&t);
        Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator+
                  (&local_150,
                   (MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)
                   (r.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                    array + 2),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
                    *)&local_170);
        Eigen::Matrix<double,1,3,1,1,3>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const>const>>
                  ((Matrix<double,1,3,1,1,3> *)local_120,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>_>
                    *)&local_150);
        std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
        pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_true>
                  (__return_storage_ptr__,
                   closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array + 2,(Matrix<double,_1,_3,_1,_1,_3> *)local_120);
      }
      else {
        std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
        pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_true>
                  (__return_storage_ptr__,
                   (double *)
                   dif.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data
                   .array[2],b);
      }
    }
    else {
      std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
      pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_true>(__return_storage_ptr__,t0,a);
    }
  }
  else {
    std::pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
    pair<double,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_true>(__return_storage_ptr__,t0,a);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParameterPoint project_to_line(const Vector& point, const Vector& a, const Vector& b, const double& t0, const double& t1)
    {
        const Vector dif = b - a;
        const double l = squared_norm(dif);

        if (l < 1e-14) {
            return {t0, a};
        }

        const Vector o = a;
        const Vector r = dif * (1.0 / l);
        const Vector o2pt = point - o;
        const double do2ptr = dot(o2pt, r);

        if (do2ptr < 0) {
            return {t0, a};
        }

        if (do2ptr > 1) {
            return {t1, b};
        }

        const double t = t0 + (t1 - t0) * do2ptr;
        const Vector closest_point = o + dif * do2ptr;

        return {t, closest_point};
    }